

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallBuffer.hpp
# Opt level: O0

void __thiscall helics::SmallBuffer::SmallBuffer(SmallBuffer *this,void *data,size_t size)

{
  pointer pvVar1;
  size_t in_RDX;
  void *in_RSI;
  SmallBuffer *in_RDI;
  size_t in_stack_ffffffffffffffd8;
  
  memset(in_RDI,0,0x40);
  (in_RDI->buffer)._M_elems[0] = 0;
  in_RDI->bufferSize = 0;
  in_RDI->bufferCapacity = 0x40;
  pvVar1 = std::array<std::byte,_64UL>::data((array<std::byte,_64UL> *)0x2b6466);
  in_RDI->heap = pvVar1;
  in_RDI->nonOwning = false;
  in_RDI->locked = false;
  in_RDI->usingAllocatedBuffer = false;
  in_RDI->errorCondition = '\0';
  in_RDI->userKey = 0;
  resize(in_RDI,in_stack_ffffffffffffffd8);
  memcpy(in_RDI->heap,in_RSI,in_RDX);
  return;
}

Assistant:

SmallBuffer(const void* data, size_t size): heap(buffer.data())
    {
        resize(size);
        std::memcpy(heap, data, size);
    }